

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandTestRPO(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  uint local_38;
  int local_34;
  
  Extra_UtilGetoptReset();
  iVar3 = -1;
  local_38 = 0;
  local_34 = -1;
LAB_001f671c:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"TNvh");
    iVar1 = globalUtilOptind;
    if (iVar2 == 0x54) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
LAB_001f67b6:
        iVar3 = -1;
        goto LAB_001f67c3;
      }
      iVar3 = atoi(argv[globalUtilOptind]);
      iVar2 = iVar3;
    }
    else {
      if (iVar2 == -1) {
        if (globalUtilOptind + 1 == argc) {
          Abc_RpoTest(argv[globalUtilOptind],local_34,iVar3,local_38);
          return 0;
        }
        pcVar4 = "Input file is not given.\n";
        iVar3 = 1;
LAB_001f67c3:
        Abc_Print(iVar3,pcVar4);
        goto LAB_001f67cb;
      }
      if (iVar2 == 0x76) {
        local_38 = local_38 ^ 1;
        goto LAB_001f671c;
      }
      if (iVar2 != 0x4e) goto LAB_001f67cb;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_001f67b6;
      }
      local_34 = atoi(argv[globalUtilOptind]);
      iVar2 = local_34;
    }
    globalUtilOptind = iVar1 + 1;
    if (iVar2 < 0) {
LAB_001f67cb:
      Abc_Print(-2,"usage: testrpo [-NT <num>] [-vh] <file>\n");
      Abc_Print(-2,"\t           RPO algorithm developed and implemented by Mayler G. A. Martins,\n"
               );
      Abc_Print(-2,"\t           Vinicius Callegaro, Renato P. Ribas and Andre\' I. Reis\n");
      Abc_Print(-2,"\t           at Federal University of Rio Grande do Sul, Porto Alegre, Brazil\n"
               );
      Abc_Print(-2,
                "\t-N <num> : the number of support variables (binary files only) [default = unused]\n"
               );
      Abc_Print(-2,
                "\t-T <num> : the number of recursions accepted before abort [default = INFINITE]\n"
               );
      pcVar4 = "yes";
      if (local_38 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      Abc_Print(-2,
                "\t<file>   : a text file with truth tables in hexadecimal, listed one per line,\n")
      ;
      Abc_Print(-2,"\t           or a binary file with an array of truth tables (in this case,\n");
      Abc_Print(-2,"\t           -N <num> is required to determine how many functions are stored)\n"
               );
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandTestRPO(Abc_Frame_t * pAbc, int argc, char ** argv) {
    extern int Abc_RpoTest(char * pFileName, int nVarNum, int nThreshold, int fVerbose);
    char * pFileName;
    int c;
    int nVarNum = -1;
    int fVerbose = 0;
    int nThreshold = -1;
    Extra_UtilGetoptReset();
    while ((c = Extra_UtilGetopt(argc, argv, "TNvh")) != EOF) {
        switch (c) {
            case 'N':
                if (globalUtilOptind >= argc) {
                    Abc_Print(-1, "Command line switch \"-N\" should be followed by an integer.\n");
                    goto usage;
                }
                nVarNum = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if (nVarNum < 0)
                    goto usage;
                break;
            case 'T':
                if (globalUtilOptind >= argc) {
                    Abc_Print(-1, "Command line switch \"-T\" should be followed by an integer.\n");
                    goto usage;
                }
                nThreshold = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if (nThreshold < 0)
                    goto usage;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if (argc != globalUtilOptind + 1) 
    {
        Abc_Print(1, "Input file is not given.\n");
        goto usage;
    }
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // call the testbench
    Abc_RpoTest( pFileName, nVarNum, nThreshold, fVerbose );
    return 0;

usage:
    Abc_Print(-2, "usage: testrpo [-NT <num>] [-vh] <file>\n");
    Abc_Print(-2, "\t           RPO algorithm developed and implemented by Mayler G. A. Martins,\n");
    Abc_Print(-2, "\t           Vinicius Callegaro, Renato P. Ribas and Andre' I. Reis\n");
    Abc_Print(-2, "\t           at Federal University of Rio Grande do Sul, Porto Alegre, Brazil\n");
    Abc_Print(-2, "\t-N <num> : the number of support variables (binary files only) [default = unused]\n");
    Abc_Print(-2, "\t-T <num> : the number of recursions accepted before abort [default = INFINITE]\n");
    Abc_Print(-2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose ? "yes" : "no");
    Abc_Print(-2, "\t-h       : print the command usage\n");
    Abc_Print(-2, "\t<file>   : a text file with truth tables in hexadecimal, listed one per line,\n");
    Abc_Print(-2, "\t           or a binary file with an array of truth tables (in this case,\n");
    Abc_Print(-2, "\t           -N <num> is required to determine how many functions are stored)\n");
    return 1;
}